

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O3

bool __thiscall
gss::innards::HomomorphismSearcher::propagate_occur_less_thans
          (HomomorphismSearcher *this,
          optional<gss::innards::HomomorphismAssignment> *current_assignment,
          HomomorphismAssignments *assignments,Domains *new_domains)

{
  uint *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  pointer ppVar5;
  pointer pHVar6;
  pointer pHVar7;
  pointer pHVar8;
  pointer pHVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  HomomorphismAssignment *pHVar13;
  HomomorphismAssignment *pHVar14;
  HomomorphismDomain *d;
  pointer poVar15;
  ulong uVar16;
  SVOBitset *pSVar17;
  long lVar18;
  pointer pHVar19;
  uint uVar20;
  type *a;
  pointer ppVar21;
  pointer poVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  SVOBitset *pSVar26;
  pointer pHVar27;
  bool bVar28;
  HomomorphismDomain *d_2;
  uint uVar29;
  pointer ppVar30;
  Domains *__range3;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  occurs;
  anon_class_24_3_9ba074a0 build_occurs;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  local_60;
  anon_class_24_3_9ba074a0 local_48;
  
  std::
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  ::vector(&local_60,(ulong)this->model->target_size,(allocator_type *)&local_48);
  ppVar21 = (this->model->target_occur_less_thans_in_convenient_order).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->model->target_occur_less_thans_in_convenient_order).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48.occurs = &local_60;
  local_48.this = this;
  local_48.new_domains = new_domains;
  if (ppVar21 != ppVar5) {
    do {
      propagate_occur_less_thans::anon_class_24_3_9ba074a0::operator()(&local_48,ppVar21->first);
      propagate_occur_less_thans::anon_class_24_3_9ba074a0::operator()(&local_48,ppVar21->second);
      ppVar21 = ppVar21 + 1;
    } while (ppVar21 != ppVar5);
  }
  poVar22 = local_60.
            super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pHVar7 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar6 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pHVar27 = pHVar6; pHVar27 != pHVar7; pHVar27 = pHVar27 + 1) {
    uVar3 = (pHVar27->assignment).target_vertex;
    if (local_60.
        super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar3].
        super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
        super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
        super__Optional_payload_base<gss::innards::SVOBitset>._M_engaged == true) {
      poVar15 = local_60.
                super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar3;
      if (0x10 < (poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.n_words)
      {
        poVar15 = *(pointer *)
                   &(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                    _M_payload.super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                    super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
      }
      uVar3 = (pHVar27->assignment).pattern_vertex;
      uVar25 = uVar3 + 0x3f;
      if (-1 < (int)uVar3) {
        uVar25 = uVar3;
      }
      puVar2 = (ulong *)((long)&(poVar15->
                                super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                                _M_payload.
                                super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>
                                .super__Optional_payload_base<gss::innards::SVOBitset>._M_payload +
                        (long)((int)uVar25 >> 6) * 8);
      *puVar2 = *puVar2 | 1L << ((ulong)uVar3 & 0x3f);
    }
  }
  ppVar21 = (this->model->target_occur_less_thans_in_convenient_order).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->model->target_occur_less_thans_in_convenient_order).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar21 != ppVar5) {
    pHVar8 = (new_domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pHVar9 = (new_domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar30 = ppVar21;
    do {
      uVar3 = ppVar30->first;
      uVar16 = (ulong)poVar22[uVar3].super__Optional_base<gss::innards::SVOBitset,_false,_false>.
                      _M_payload.
                      super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                      super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.
                      n_words;
      if (uVar16 < 0x11) {
        poVar15 = poVar22 + uVar3;
      }
      else {
        poVar15 = *(pointer *)
                   &poVar22[uVar3].super__Optional_base<gss::innards::SVOBitset,_false,_false>.
                    _M_payload.super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                    super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
      }
      if (uVar16 != 0) {
        lVar18 = 0;
LAB_00134898:
        uVar10 = *(ulong *)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                            super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
        if (uVar10 == 0) goto code_r0x001348a0;
        iVar12 = 0;
        for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
          iVar12 = iVar12 + 1;
        }
        if (iVar12 + 1 == (int)lVar18) goto LAB_001348c2;
        if (pHVar8 == pHVar9) goto LAB_0013496b;
        pHVar19 = pHVar8;
        while (uVar3 = pHVar19->v, (uint)(iVar12 - (int)lVar18) <= uVar3) {
LAB_00134a3f:
          pHVar19 = pHVar19 + 1;
          if (pHVar19 == pHVar9) goto LAB_0013496b;
        }
        uVar25 = (pHVar19->values).n_words;
        pSVar17 = &pHVar19->values;
        pSVar26 = pSVar17;
        if (0x10 < uVar25) {
          pSVar26 = (SVOBitset *)(pHVar19->values)._data.short_data[0];
        }
        uVar4 = ppVar30->second;
        uVar20 = uVar4 + 0x3f;
        if (-1 < (int)uVar4) {
          uVar20 = uVar4;
        }
        if (((pSVar26->_data).short_data[(int)uVar20 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) == 0)
        goto LAB_00134a3f;
        if (poVar22[uVar4].super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
            super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
            super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.n_words < 0x11
           ) {
          poVar15 = poVar22 + uVar4;
        }
        else {
          poVar15 = *(pointer *)
                     &poVar22[uVar4].super__Optional_base<gss::innards::SVOBitset,_false,_false>.
                      _M_payload.
                      super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                      super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
        }
        bVar11 = (byte)uVar3 & 0x3f;
        uVar29 = uVar3 + 0x3f;
        if (-1 < (int)uVar3) {
          uVar29 = uVar3;
        }
        puVar2 = (ulong *)((long)&(poVar15->
                                  super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                                  _M_payload.
                                  super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>
                                  .super__Optional_payload_base<gss::innards::SVOBitset>._M_payload
                          + (long)((int)uVar29 >> 6) * 8);
        *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        if (0x10 < uVar25) {
          pSVar17 = (SVOBitset *)(pHVar19->values)._data.short_data[0];
        }
        (pSVar17->_data).short_data[(int)uVar20 >> 6] =
             (pSVar17->_data).short_data[(int)uVar20 >> 6] & ~(1L << ((ulong)uVar4 & 0x3f));
        puVar1 = &pHVar19->count;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 != 0) goto LAB_00134a3f;
        goto LAB_00134bf0;
      }
LAB_001348c2:
      uVar16 = (ulong)poVar22[ppVar30->second].
                      super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
                      super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                      super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.
                      n_words;
      poVar15 = poVar22 + ppVar30->second;
      pHVar19 = pHVar8;
      if (uVar16 < 0x11) {
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x40) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x48) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x50) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x58) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x60) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x68) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x70) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x78) = 0;
        *(undefined8 *)
         &(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
          super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
          super__Optional_payload_base<gss::innards::SVOBitset>._M_payload = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 8) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x10) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x18) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x20) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x28) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x30) = 0;
        *(undefined8 *)
         ((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x38) = 0;
      }
      else {
        memset(*(void **)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                          _M_payload.
                          super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                          super__Optional_payload_base<gss::innards::SVOBitset>._M_payload,0,
               uVar16 << 3);
      }
      for (; pHVar19 != pHVar9; pHVar19 = pHVar19 + 1) {
        if ((pHVar19->values).n_words < 0x11) {
          pSVar17 = &pHVar19->values;
        }
        else {
          pSVar17 = (SVOBitset *)(pHVar19->values)._data.short_data[0];
        }
        uVar3 = ppVar30->second;
        uVar25 = uVar3 + 0x3f;
        if (-1 < (int)uVar3) {
          uVar25 = uVar3;
        }
        if (((pSVar17->_data).short_data[(int)uVar25 >> 6] >>
             ((ulong)(uint)((int)uVar3 % 0x40) & 0x3f) & 1) != 0) {
          (pSVar17->_data).short_data[(int)uVar25 >> 6] =
               ~(1L << ((ulong)(uint)((int)uVar3 % 0x40) & 0x3f)) &
               (pSVar17->_data).short_data[(int)uVar25 >> 6];
          puVar1 = &pHVar19->count;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) goto LAB_00134bf0;
        }
      }
LAB_0013496b:
      ppVar30 = ppVar30 + 1;
    } while (ppVar30 != ppVar5);
  }
  if ((ppVar21 != ppVar5) &&
     ((current_assignment->super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>).
      _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_engaged !=
      false)) {
    uVar3 = (current_assignment->
            super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>)._M_payload.
            super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload._M_value.
            target_vertex;
    uVar25 = (current_assignment->
             super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>)._M_payload.
             super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload._M_value.
             pattern_vertex;
    pHVar8 = (new_domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pHVar9 = (new_domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (ppVar21->second == uVar3) {
        if (pHVar8 == pHVar9) {
          bVar28 = false;
        }
        else {
          bVar28 = false;
          pHVar19 = pHVar8;
          do {
            uVar4 = pHVar19->v;
            if (uVar4 < uVar25) {
              if ((pHVar19->values).n_words < 0x11) {
                pSVar17 = &pHVar19->values;
              }
              else {
                pSVar17 = (SVOBitset *)(pHVar19->values)._data.short_data[0];
              }
              uVar4 = ppVar21->first;
              uVar20 = uVar4 + 0x3f;
              if (-1 < (int)uVar4) {
                uVar20 = uVar4;
              }
              bVar28 = (bool)(bVar28 | ((pSVar17->_data).short_data[(int)uVar20 >> 6] >>
                                        ((ulong)uVar4 & 0x3f) & 1) != 0);
            }
            else if (uVar25 < uVar4) {
              uVar20 = (pHVar19->values).n_words;
              pSVar17 = &pHVar19->values;
              pSVar26 = pSVar17;
              if (0x10 < uVar20) {
                pSVar26 = (SVOBitset *)(pHVar19->values)._data.short_data[0];
              }
              uVar29 = ppVar21->first;
              uVar23 = uVar29 + 0x3f;
              if (-1 < (int)uVar29) {
                uVar23 = uVar29;
              }
              if (((pSVar26->_data).short_data[(int)uVar23 >> 6] >> ((ulong)uVar29 & 0x3f) & 1) != 0
                 ) {
                if (local_60.
                    super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar29].
                    super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
                    super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                    super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.
                    n_words < 0x11) {
                  poVar22 = local_60.
                            super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar29;
                }
                else {
                  poVar22 = *(pointer *)
                             &local_60.
                              super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar29].
                              super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload
                              .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                              super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
                }
                bVar11 = (byte)uVar4 & 0x3f;
                uVar24 = uVar4 + 0x3f;
                if (-1 < (int)uVar4) {
                  uVar24 = uVar4;
                }
                puVar2 = (ulong *)((long)&(poVar22->
                                          super__Optional_base<gss::innards::SVOBitset,_false,_false>
                                          )._M_payload.
                                          super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>
                                          .super__Optional_payload_base<gss::innards::SVOBitset>.
                                          _M_payload + (long)((int)uVar24 >> 6) * 8);
                *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
                if (0x10 < uVar20) {
                  pSVar17 = (SVOBitset *)(pHVar19->values)._data.short_data[0];
                }
                (pSVar17->_data).short_data[(int)uVar23 >> 6] =
                     (pSVar17->_data).short_data[(int)uVar23 >> 6] & ~(1L << ((ulong)uVar29 & 0x3f))
                ;
                puVar1 = &pHVar19->count;
                *puVar1 = *puVar1 - 1;
                if (*puVar1 == 0) goto LAB_00134bf0;
              }
            }
            pHVar19 = pHVar19 + 1;
          } while (pHVar19 != pHVar9);
        }
        if (pHVar6 != pHVar7) {
          pHVar27 = pHVar6;
          do {
            pHVar13 = &pHVar27->assignment;
            pHVar14 = &pHVar27->assignment;
            pHVar27 = pHVar27 + 1;
            bVar28 = (bool)(bVar28 | (ppVar21->first == pHVar14->target_vertex &&
                                     pHVar13->pattern_vertex < uVar25));
          } while (pHVar27 != pHVar7);
        }
        if (!bVar28) goto LAB_00134bf0;
      }
      ppVar21 = ppVar21 + 1;
    } while (ppVar21 != ppVar5);
  }
  bVar28 = true;
LAB_00134bf2:
  std::
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  ::~vector(&local_60);
  return bVar28;
code_r0x001348a0:
  lVar18 = lVar18 + -0x40;
  poVar15 = (pointer)((long)&(poVar15->super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                             _M_payload.
                             super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                             super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 8);
  if (uVar16 * 0x40 + lVar18 == 0) goto LAB_001348c2;
  goto LAB_00134898;
LAB_00134bf0:
  bVar28 = false;
  goto LAB_00134bf2;
}

Assistant:

auto HomomorphismSearcher::propagate_occur_less_thans(
    const optional<HomomorphismAssignment> & current_assignment,
    const HomomorphismAssignments & assignments,
    Domains & new_domains) -> bool
{
    vector<optional<SVOBitset>> occurs(model.target_size);

    auto build_occurs = [&](int p) -> void {
        if (occurs[p])
            return;

        occurs[p] = make_optional<SVOBitset>(model.pattern_size, 0);
        for (auto & d : new_domains)
            if (d.values.test(p))
                occurs[p]->set(d.v);
    };

    for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
        build_occurs(a);
        build_occurs(b);
    }

    for (auto & a : assignments.values)
        if (occurs[a.assignment.target_vertex])
            occurs[a.assignment.target_vertex]->set(a.assignment.pattern_vertex);

    // propagate lower bounds
    for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
        auto first_a = occurs[a]->find_first();
        if (first_a == SVOBitset::npos) {
            // no occurrence of value a, value b cannot be used either
            occurs[b]->reset();
            for (auto & d : new_domains)
                if (d.values.test(b)) {
                    d.values.reset(b);
                    if (0 == --d.count)
                        return false;
                }
        }
        else {
            // value a first occurs in variable x, value b cannot be used in a variable lower than x
            for (auto & d : new_domains) {
                if (d.v < first_a && d.values.test(b)) {
                    occurs[b]->reset(d.v);
                    d.values.reset(b);
                    if (0 == --d.count)
                        return false;
                }
            }
        }
    }

    // propagate other way: if value b must occur (because it has been assigned) then
    // value a must go before
    if (current_assignment) {
        for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
            if (b != current_assignment->target_vertex)
                continue;

            bool saw_an_a = false;
            for (auto & d : new_domains) {
                if (d.v < current_assignment->pattern_vertex) {
                    // it's before
                    if (d.values.test(a))
                        saw_an_a = true;
                }
                else if (d.v > current_assignment->pattern_vertex) {
                    // comes after, can't use a
                    if (d.values.test(a)) {
                        occurs[a]->reset(d.v);
                        d.values.reset(a);
                        if (0 == --d.count)
                            return false;
                    }
                }
            }

            for (auto & d : assignments.values)
                if (d.assignment.pattern_vertex < current_assignment->pattern_vertex && a == d.assignment.target_vertex)
                    saw_an_a = true;

            if (! saw_an_a)
                return false;
        }
    }

    return true;
}